

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

int __thiscall QWidgetTextControlPrivate::init(QWidgetTextControlPrivate *this,EVP_PKEY_CTX *ctx)

{
  int width;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  QTextDocument *in_stack_000000f0;
  QString *in_stack_000000f8;
  TextFormat in_stack_00000104;
  QWidgetTextControlPrivate *in_stack_00000108;
  undefined1 uVar1;
  QWidgetTextControlPrivate *this_01;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  QTextDocument *this_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  width = (int)ctx;
  this_01 = this;
  q_func(this);
  setContent(in_stack_00000108,in_stack_00000104,in_stack_000000f8,in_stack_000000f0);
  this_00 = this->doc;
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)this_00,
                  (TextInteractionFlag)((ulong)this >> 0x20));
  uVar1 = SUB81(this_00,0);
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  QTextDocument::setUndoRedoEnabled((bool)uVar1);
  QWidgetTextControl::setCursorWidth((QWidgetTextControl *)this_01,width);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::init(Qt::TextFormat format, const QString &text, QTextDocument *document)
{
    Q_Q(QWidgetTextControl);
    setContent(format, text, document);

    doc->setUndoRedoEnabled(interactionFlags & Qt::TextEditable);
    q->setCursorWidth(-1);
}